

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O3

void __thiscall FlasherInfo::print(FlasherInfo *this)

{
  bool bVar1;
  _Bit_type *p_Var2;
  _Bit_type *p_Var3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  
  uVar5 = 0;
  printf("Device       : %s\n",(this->name)._M_dataplus._M_p);
  printf("Version      : %s\n",(this->version)._M_dataplus._M_p);
  printf("Address      : 0x%x\n",(ulong)this->address);
  printf("Pages        : %d\n",(ulong)this->numPages);
  printf("Page Size    : %d bytes\n",(ulong)this->pageSize);
  printf("Total Size   : %dKB\n",(ulong)(this->totalSize >> 10));
  printf("Planes       : %d\n",(ulong)this->numPlanes);
  printf("Lock Regions : %zd\n",
         (ulong)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
         ((long)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
         (long)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8);
  printf("Locked       : ");
  p_Var2 = (this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  p_Var3 = (this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar4 = (ulong)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (((long)p_Var3 - (long)p_Var2) * 8 + uVar4 == 0) {
    pcVar7 = "none";
  }
  else {
    bVar1 = true;
    pcVar7 = "";
    do {
      if ((p_Var2[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) {
        pcVar6 = ",";
        if (bVar1) {
          pcVar6 = "";
        }
        bVar1 = false;
        printf("%s%d",pcVar6,uVar5);
        p_Var2 = (this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        p_Var3 = (this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
        uVar4 = (ulong)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < uVar4 + ((long)p_Var3 - (long)p_Var2) * 8);
    if (bVar1) {
      pcVar7 = "none";
    }
  }
  puts(pcVar7);
  pcVar6 = "false";
  pcVar7 = "false";
  if (this->security != false) {
    pcVar7 = "true";
  }
  printf("Security     : %s\n",pcVar7);
  if (this->canBootFlash != false) {
    pcVar7 = "false";
    if (this->bootFlash != false) {
      pcVar7 = "true";
    }
    printf("Boot Flash   : %s\n",pcVar7);
  }
  if (this->canBod == true) {
    pcVar7 = "false";
    if (this->bod != false) {
      pcVar7 = "true";
    }
    printf("BOD          : %s\n",pcVar7);
  }
  if (this->canBor == true) {
    if (this->bor != false) {
      pcVar6 = "true";
    }
    printf("BOR          : %s\n",pcVar6);
    return;
  }
  return;
}

Assistant:

void
FlasherInfo::print()
{
    bool first;

    printf("Device       : %s\n", name.c_str());
    printf("Version      : %s\n", version.c_str());
    printf("Address      : 0x%x\n", address);
    printf("Pages        : %d\n", numPages);
    printf("Page Size    : %d bytes\n", pageSize);
    printf("Total Size   : %dKB\n", totalSize / 1024);
    printf("Planes       : %d\n", numPlanes);
    printf("Lock Regions : %zd\n", lockRegions.size());
    printf("Locked       : ");
    first = true;
    for (uint32_t region = 0; region < lockRegions.size(); region++)
    {
        if (lockRegions[region])
        {
            printf("%s%d", first ? "" : ",", region);
            first = false;
        }
    }
    printf("%s\n", first ? "none" : "");
    printf("Security     : %s\n", security ? "true" : "false");
    if (canBootFlash)
        printf("Boot Flash   : %s\n", bootFlash ? "true" : "false");
    if (canBod)
        printf("BOD          : %s\n", bod ? "true" : "false");
    if (canBor)
        printf("BOR          : %s\n", bor ? "true" : "false");
}